

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void laguerre_poly_coef(int n,double *c)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  double *c_local;
  int n_local;
  
  if (-1 < n) {
    for (local_1c = 0; local_1c <= n; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 <= n; local_20 = local_20 + 1) {
        c[local_1c + local_20 * (n + 1)] = 0.0;
      }
    }
    for (local_1c = 0; local_1c <= n; local_1c = local_1c + 1) {
      c[local_1c] = 1.0;
    }
    if (n != 0) {
      c[n + 2] = -1.0;
      for (local_1c = 2; local_1c <= n; local_1c = local_1c + 1) {
        for (local_20 = 1; local_20 <= n; local_20 = local_20 + 1) {
          c[local_1c + local_20 * (n + 1)] =
               (((double)(local_1c * 2 + -1) * c[local_1c + -1 + local_20 * (n + 1)] +
                (double)(1 - local_1c) * c[local_1c + -2 + local_20 * (n + 1)]) -
               c[local_1c + -1 + (local_20 + -1) * (n + 1)]) / (double)local_1c;
        }
      }
    }
  }
  return;
}

Assistant:

void laguerre_poly_coef ( int n, double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    LAGUERRE_POLY_COEF evaluates the Laguerre polynomial coefficients.
//
//  First terms:
//
//    0: 1
//    1: 1  -1
//    2: 1  -2  1/2
//    3: 1  -3  3/2  1/6
//    4: 1  -4  4   -2/3  1/24
//    5: 1  -5  5   -5/3  5/24  -1/120
//
//  Recursion:
//
//    L(0) = ( 1,  0, 0, ..., 0 )
//    L(1) = ( 1, -1, 0, ..., 0 )
//    L(N) = (2*N-1-X) * L(N-1) - (N-1) * L(N-2) / N
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    01 February 2003
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//  Parameters:
//
//    Input, int N, the highest order polynomial to compute.
//    Note that polynomials 0 through N will be computed.
//
//    Output, double C[(N+1)*(N+1)], the coefficients of the Laguerre 
//    polynomials of degree 0 through N.  Each polynomial is stored as a row.
//
{
  int i;
  int j;

  if ( n < 0 )
  {
    return;
  }

  for ( i = 0; i <= n; i++ )
  {
    for ( j = 0; j <= n; j++ )
    {
      c[i+j*(n+1)] = 0.0;
    }
  }

  for ( i = 0; i <= n; i++ )
  {
    c[i+0*(n+1)] = 1.0;
  }

  if ( n == 0 )
  {
    return;
  }

  c[1+1*(n+1)] = -1.0;

  for ( i = 2; i <= n; i++ )
  {
    for ( j = 1; j <= n; j++ )
    {
      c[i+j*(n+1)] = ( 
          double( 2 * i - 1 ) * c[i-1+j*(n+1)] 
        + double(   - i + 1 ) * c[i-2+j*(n+1)] 
        -                          c[i-1+(j-1)*(n+1)] ) 
        / double(i);
    }
 
  }

  return;
}